

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  int x;
  uint uVar2;
  undefined8 uStack_38;
  int n;
  
  uStack_38 = in_RAX;
  do {
    printf("Enter a number from 2 to 10: ");
    iVar1 = __isoc99_scanf("%d",&n);
    if (iVar1 == 1) {
      if (n - 0xbU < 0xfffffff7) {
        puts("The number must be between 2 and 10.");
      }
    }
    else {
      if (iVar1 == -1) {
        putchar(10);
        return 0;
      }
      puts("Please enter a valid number.");
      __isoc99_scanf("%*[^\n]");
    }
  } while (n - 0xbU < 0xfffffff7);
  for (uVar2 = 1; uVar2 != 0xb; uVar2 = uVar2 + 1) {
    printf("%d * %d = %d\n",(ulong)(uint)n,(ulong)uVar2,(ulong)(n * uVar2));
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int n;
  do {
    printf("Enter a number from 2 to 10: ");
    const int res = scanf("%d", &n);

    if (res == 1) {
      if (n < 2 || n > 10) printf("The number must be between 2 and 10.\n");
    } else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      printf("Please enter a valid number.\n");
      scanf("%*[^\n]"); // "swallows" any non-10 character, as to clear the input buffer
    }
  } while (n < 2 || n > 10);

  for (int x = 1; x <= 10; x++) {
    printf("%d * %d = %d\n", n, x, n * x);
  }

  return 0;
}